

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpolynomial.cpp
# Opt level: O1

int __thiscall TPZPolynomial::GetRoots(TPZPolynomial *this,TPZVec<double> *r)

{
  double dVar1;
  long lVar2;
  
  lVar2 = 0;
  while ((dVar1 = (this->fCo).fStore[lVar2], dVar1 != -99.999 || (NAN(dVar1)))) {
    lVar2 = lVar2 + 1;
    if (lVar2 == 3) {
      TPZVec<double>::operator=(r,&this->fReal);
      return 1;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "TPZPolynomial::GetRoots.\nERRO: Coeficientes ainda nao foram especificados.\n",0x4b);
  return -1;
}

Assistant:

int TPZPolynomial::GetRoots(TPZVec<REAL> & r) {
    int i;
    for (i = 0; i < 3; i++)
        if (fCo[i] == -99.999) {
            cout << "TPZPolynomial::GetRoots.\nERRO: Coeficientes ainda nao foram especificados.\n";
            return -1;
        }
	r  = fReal;
    return 1;
}